

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

bool __thiscall soul::heart::ArrayElement::readsVariable(ArrayElement *this,Variable *v)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Expression *pEVar4;
  byte local_29;
  byte local_19;
  Variable *v_local;
  ArrayElement *this_local;
  
  pEVar4 = pool_ref<soul::heart::Expression>::operator->(&this->parent);
  uVar2 = (*(pEVar4->super_Object)._vptr_Object[4])(pEVar4,v);
  local_19 = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = isDynamic(this);
    local_29 = 0;
    if (bVar1) {
      pEVar4 = pool_ptr<soul::heart::Expression>::operator->(&this->dynamicIndex);
      iVar3 = (*(pEVar4->super_Object)._vptr_Object[4])(pEVar4,v);
      local_29 = (byte)iVar3;
    }
    local_19 = local_29;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool readsVariable (Variable& v) const override    { return parent->readsVariable (v) || (isDynamic() && dynamicIndex->readsVariable (v)); }